

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::clear(Board *this)

{
  long *plVar1;
  void *pvVar2;
  Vector2f *size;
  long in_RDI;
  uint x;
  uint y;
  Text *this_00;
  locale *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  String *in_stack_ffffffffffffffc0;
  Vector2<unsigned_int> local_18;
  float local_10;
  float local_c;
  
  for (local_c = 0.0; (uint)local_c < (uint)*(float *)(in_RDI + 0x304);
      local_c = (float)((int)local_c + 1)) {
    for (local_10 = 0.0; (uint)local_10 < (uint)*(float *)(in_RDI + 0x300);
        local_10 = (float)((int)local_10 + 1)) {
      plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 0x308) + (ulong)(uint)local_c * 8) +
                         (ulong)(uint)local_10 * 8);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    pvVar2 = *(void **)(*(long *)(in_RDI + 0x308) + (ulong)(uint)local_c * 8);
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
  }
  if (*(void **)(in_RDI + 0x308) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x308));
  }
  sf::VertexArray::clear((VertexArray *)0x140451);
  sf::Vector2<unsigned_int>::Vector2(&stack0xffffffffffffffe8,0,0);
  *(Vector2<unsigned_int> *)(in_RDI + 0x300) = local_18;
  *(undefined8 *)(in_RDI + 0x308) = 0;
  size = (Vector2f *)(in_RDI + 0x310);
  this_00 = (Text *)&stack0xffffffffffffffe0;
  sf::Vector2<float>::Vector2((Vector2<float> *)this_00,0.0,0.0);
  sf::RectangleShape::setSize((RectangleShape *)this_00,size);
  std::locale::locale((locale *)&stack0xffffffffffffffb8);
  sf::String::String(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  sf::Text::setString(this_00,(String *)size);
  sf::String::~String((String *)0x140500);
  std::locale::~locale((locale *)&stack0xffffffffffffffb8);
  *(undefined1 *)(in_RDI + 0xd8) = 0;
  return;
}

Assistant:

void Board::clear() {
    for (unsigned int y = 0; y < _size.y; ++y) {
        for (unsigned int x = 0; x < _size.x; ++x) {
            delete _tileArray[y][x];
        }
        delete[] _tileArray[y];
    }
    delete[] _tileArray;
    _vertices.clear();
    _size = Vector2u(0, 0);
    _tileArray = nullptr;
    _notesBox.setSize(Vector2f(0.0f, 0.0f));
    _notesText.setString("");
    changesMade = false;
}